

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9745:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9745:35)>
          *this,string *arg)

{
  bool bVar1;
  InWhatOrder IVar2;
  long in_FS_OFFSET;
  BasicResult<Catch::clara::detail::ParseResultType> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&temp);
  local_b8.m_errorMessage._M_dataplus._M_p = (pointer)&local_b8.m_errorMessage.field_2;
  local_b8.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_b8.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_b8.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001e2768;
  local_b8.m_errorMessage._M_string_length = 0;
  local_b8.m_errorMessage.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&local_48,"declared",(allocator *)&local_68);
  bVar1 = startsWith(&local_48,&temp);
  ::std::__cxx11::string::~string((string *)&local_48);
  IVar2 = InDeclarationOrder;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_48,"lexical",(allocator *)&local_68);
    bVar1 = startsWith(&local_48,&temp);
    ::std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      IVar2 = InLexicographicalOrder;
    }
    else {
      ::std::__cxx11::string::string((string *)&local_48,"random",(allocator *)&local_68);
      bVar1 = startsWith(&local_48,&temp);
      ::std::__cxx11::string::~string((string *)&local_48);
      if (!bVar1) {
        ::std::operator+(&local_68,"Unrecognised ordering: \'",&temp);
        ::std::operator+(&local_48,&local_68,"\'");
        BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                  (__return_storage_ptr__,&local_48);
        ::std::__cxx11::string::~string((string *)&local_48);
        ::std::__cxx11::string::~string((string *)&local_68);
        goto LAB_0018fa70;
      }
      IVar2 = InRandomOrder;
    }
  }
  ((this->m_lambda).config)->runOrder = IVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001e2768;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0018fa70:
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_b8);
  ::std::__cxx11::string::~string((string *)&temp);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }